

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::apply<QCmyk32,unsigned_char>
          (QColorTransformPrivate *this,QCmyk32 *dst,uchar *src,qsizetype count,TransformFlags flags
          )

{
  long lVar1;
  bool bVar2;
  QColorSpacePrivate *pQVar3;
  longlong *plVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  QColorTransformPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype i;
  QUninitialized<QColorVector,_256> buffer;
  long in_stack_ffffffffffffef98;
  QColorVector *in_stack_ffffffffffffefa0;
  QCmyk32 *dst_00;
  QColorTransformPrivate *in_stack_ffffffffffffefb8;
  QColorTransformPrivate *this_00;
  long local_1018;
  undefined4 in_stack_ffffffffffffeff0;
  QUninitialized local_1008 [4];
  QFlagsStorage<QColorTransformPrivate::TransformFlag> in_stack_ffffffffffffeffc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d6cb8);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsIn(in_stack_ffffffffffffefb8);
  }
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d6cde);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsOut(in_stack_ffffffffffffefb8);
  }
  for (this_00 = (QColorTransformPrivate *)0x0; (long)this_00 < in_RCX;
      this_00 = (QColorTransformPrivate *)
                ((long)&(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                (long)&dst_00->m_cmyk)) {
    local_1018 = in_RCX - (long)this_00;
    plVar4 = qMin<long_long>(&local_1018,&WorkBlockSize);
    dst_00 = (QCmyk32 *)*plVar4;
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertIn<unsigned_char>
              (this_00,(uchar *)dst_00,(QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffeff0),
               (qsizetype)in_RDI,(TransformFlags)in_stack_ffffffffffffeffc.i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    pcsAdapt(in_RDI,in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
    in_stack_ffffffffffffef98 = in_RSI + (long)this_00 * 4;
    in_stack_ffffffffffffefa0 =
         (QColorVector *)
         ((long)&(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + in_RDX);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertOut<QCmyk32,unsigned_char>
              (this_00,dst_00,(uchar *)in_RDI,
               (QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffeff0),
               (qsizetype)in_stack_ffffffffffffefa0,(TransformFlags)in_stack_ffffffffffffeffc.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}